

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_writer.cc
# Opt level: O1

Status __thiscall
leveldb::log::Writer::EmitPhysicalRecord(Writer *this,RecordType t,char *ptr,size_t length)

{
  WritableFile *pWVar1;
  uint32_t uVar2;
  undefined4 in_register_00000034;
  undefined8 *puVar3;
  ulong in_R8;
  char buf [7];
  WritableFile *local_48;
  WritableFile *local_40;
  undefined8 local_38;
  int local_30;
  undefined1 local_2c;
  undefined1 local_2b;
  undefined1 local_2a;
  
  puVar3 = (undefined8 *)CONCAT44(in_register_00000034,t);
  if (0xffff < in_R8) {
    __assert_fail("length <= 0xffff",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_writer.cc"
                  ,0x54,
                  "Status leveldb::log::Writer::EmitPhysicalRecord(RecordType, const char *, size_t)"
                 );
  }
  if ((long)*(int *)(puVar3 + 1) + in_R8 + 7 < 0x8001) {
    local_2c = (undefined1)in_R8;
    local_2b = (undefined1)(in_R8 >> 8);
    local_2a = SUB81(ptr,0);
    uVar2 = crc32c::Extend(*(uint32_t *)((long)puVar3 + ((ulong)ptr & 0xffffffff) * 4 + 0xc),
                           (char *)length,in_R8);
    local_30 = (uVar2 << 0x11 | uVar2 >> 0xf) + 0xa282ead8;
    local_38 = 7;
    local_40 = (WritableFile *)&local_30;
    (**(code **)(*(long *)*puVar3 + 0x10))(this);
    if (this->dest_ == (WritableFile *)0x0) {
      local_40 = (WritableFile *)length;
      (**(code **)(*(long *)*puVar3 + 0x10))(&local_48);
      pWVar1 = this->dest_;
      this->dest_ = local_48;
      local_48 = pWVar1;
      if (pWVar1 != (WritableFile *)0x0) {
        operator_delete__(pWVar1);
      }
      if (this->dest_ == (WritableFile *)0x0) {
        (**(code **)(*(long *)*puVar3 + 0x20))(&local_40);
        pWVar1 = this->dest_;
        this->dest_ = local_40;
        if (pWVar1 != (WritableFile *)0x0) {
          local_40 = pWVar1;
          operator_delete__(pWVar1);
        }
      }
    }
    *(int *)(puVar3 + 1) = *(int *)(puVar3 + 1) + (int)in_R8 + 7;
    return (Status)(char *)this;
  }
  __assert_fail("block_offset_ + kHeaderSize + length <= kBlockSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_writer.cc"
                ,0x55,
                "Status leveldb::log::Writer::EmitPhysicalRecord(RecordType, const char *, size_t)")
  ;
}

Assistant:

Status Writer::EmitPhysicalRecord(RecordType t, const char* ptr,
                                  size_t length) {
  assert(length <= 0xffff);  // Must fit in two bytes
  assert(block_offset_ + kHeaderSize + length <= kBlockSize);

  // Format the header
  char buf[kHeaderSize];
  buf[4] = static_cast<char>(length & 0xff);
  buf[5] = static_cast<char>(length >> 8);
  buf[6] = static_cast<char>(t);

  // Compute the crc of the record type and the payload.
  uint32_t crc = crc32c::Extend(type_crc_[t], ptr, length);
  crc = crc32c::Mask(crc);  // Adjust for storage
  EncodeFixed32(buf, crc);

  // Write the header and the payload
  Status s = dest_->Append(Slice(buf, kHeaderSize));
  if (s.ok()) {
    s = dest_->Append(Slice(ptr, length));
    if (s.ok()) {
      s = dest_->Flush();
    }
  }
  block_offset_ += kHeaderSize + length;
  return s;
}